

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O1

unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> __thiscall
duckdb::DetachInfo::Deserialize(DetachInfo *this,Deserializer *deserializer)

{
  OnEntryNotFound OVar1;
  uint uVar2;
  int iVar3;
  DetachInfo *this_00;
  pointer pDVar4;
  pointer *__ptr;
  unique_ptr<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>,_true> result;
  string str;
  _Head_base<0UL,_duckdb::DetachInfo_*,_false> local_58;
  char *local_50;
  undefined8 local_48;
  char local_40 [16];
  
  this_00 = (DetachInfo *)operator_new(0x38);
  DetachInfo(this_00);
  local_58._M_head_impl = this_00;
  pDVar4 = unique_ptr<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>,_true>::operator->
                     ((unique_ptr<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>,_true>
                       *)&local_58);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"name");
  if ((char)uVar2 == '\0') {
    local_48 = 0;
    local_40[0] = '\0';
    local_50 = local_40;
    ::std::__cxx11::string::operator=((string *)&pDVar4->name,(string *)&local_50);
    if (local_50 == local_40) goto LAB_0177a45f;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pDVar4->name,(string *)&local_50);
    if (local_50 == local_40) goto LAB_0177a45f;
  }
  operator_delete(local_50);
LAB_0177a45f:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  pDVar4 = unique_ptr<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>,_true>::operator->
                     ((unique_ptr<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>,_true>
                       *)&local_58);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xc9,"if_not_found");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    OVar1 = EnumUtil::FromString<duckdb::OnEntryNotFound>(local_50);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    OVar1 = (OnEntryNotFound)iVar3;
  }
  pDVar4->if_not_found = OVar1;
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (this->super_ParseInfo)._vptr_ParseInfo = (_func_int **)local_58._M_head_impl;
  return (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)
         (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)this;
}

Assistant:

unique_ptr<ParseInfo> DetachInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<DetachInfo>(new DetachInfo());
	deserializer.ReadPropertyWithDefault<string>(200, "name", result->name);
	deserializer.ReadProperty<OnEntryNotFound>(201, "if_not_found", result->if_not_found);
	return std::move(result);
}